

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O2

int Pdr_ObjRegNum(Pdr_Man_t *p,int k,int iSatVar)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Aig_Obj_t *pObj;
  
  if (p->pPars->fMonoCnf == 0) {
    p_00 = (Vec_Int_t *)Vec_PtrEntry(&p->vVar2Ids,k);
    if ((iSatVar < 1) || (p_00->nSize <= iSatVar)) {
      __assert_fail("iSatVar > 0 && iSatVar < Vec_IntSize(vVar2Ids)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCnf.c"
                    ,0x122,"int Pdr_ObjRegNum2(Pdr_Man_t *, int, int)");
    }
    iVar2 = Vec_IntEntry(p_00,iSatVar);
    if (iVar2 != -1) {
      pObj = Aig_ManObj(p->pAig,iVar2);
      if (((*(uint *)&pObj->field_0x18 & 7) == 3) &&
         (pAVar1 = p->pAig, iVar2 = Aig_ObjCioId(pObj), pAVar1->nTruePos <= iVar2)) {
        iVar2 = Aig_ObjCioId(pObj);
        return iVar2 - p->pAig->nTruePos;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCnf.c"
                    ,0x129,"int Pdr_ObjRegNum2(Pdr_Man_t *, int, int)");
    }
  }
  else {
    if (iSatVar < 0) {
      __assert_fail("iSatVar >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCnf.c"
                    ,0x108,"int Pdr_ObjRegNum1(Pdr_Man_t *, int, int)");
    }
    if (iSatVar < p->pCnf1->nVars) {
      iVar2 = Vec_IntEntry(p->vVar2Reg,iSatVar);
      if ((-1 < iVar2) && (iVar2 < p->pAig->nRegs)) {
        return iVar2;
      }
      __assert_fail("RegId >= 0 && RegId < Aig_ManRegNum(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCnf.c"
                    ,0x10e,"int Pdr_ObjRegNum1(Pdr_Man_t *, int, int)");
    }
  }
  return -1;
}

Assistant:

int Pdr_ObjRegNum( Pdr_Man_t * p, int k, int iSatVar )
{
    if ( p->pPars->fMonoCnf )
        return Pdr_ObjRegNum1( p, k, iSatVar );
    else
        return Pdr_ObjRegNum2( p, k, iSatVar );
}